

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m256i alVar17;
  __m256i alVar18;
  uint uVar19;
  uint uVar20;
  parasail_result_t *ppVar21;
  __m256i *palVar22;
  __m256i *ptr;
  __m256i *ptr_00;
  int8_t *ptr_01;
  char cVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  char cVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  __m256i *palVar35;
  __m256i *palVar36;
  ulong uVar37;
  int iVar38;
  bool bVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar45 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [24];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  int iStack_1d4;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_1();
        }
        else {
          uVar20 = uVar2 - 1;
          uVar37 = (ulong)uVar2 + 0x1f >> 5;
          uVar5 = (ulong)uVar20 % uVar37;
          iVar26 = (int)(uVar20 / uVar37);
          iVar25 = ppVar4->min;
          local_218._4_4_ = -open;
          uVar24 = (uint)(byte)-(char)iVar25;
          if (iVar25 != local_218._4_4_ && SBORROW4(iVar25,local_218._4_4_) == iVar25 + open < 0) {
            uVar24 = open;
          }
          cVar29 = '~' - (char)ppVar4->max;
          ppVar21 = parasail_result_new();
          if (ppVar21 != (parasail_result_t *)0x0) {
            ppVar21->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar21->flag | 0x20100802;
            palVar22 = parasail_memalign___m256i(0x20,uVar37);
            ptr = parasail_memalign___m256i(0x20,uVar37);
            ptr_00 = parasail_memalign___m256i(0x20,uVar37);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar22 != (__m256i *)0x0)) {
              iVar25 = s2Len + -1;
              iVar30 = 0x1f - iVar26;
              uVar40 = (undefined1)open;
              uVar41 = (undefined1)gap;
              auVar53[1] = uVar41;
              auVar53[0] = uVar41;
              auVar53[2] = uVar41;
              auVar53[3] = uVar41;
              auVar53[4] = uVar41;
              auVar53[5] = uVar41;
              auVar53[6] = uVar41;
              auVar53[7] = uVar41;
              auVar53[8] = uVar41;
              auVar53[9] = uVar41;
              auVar53[10] = uVar41;
              auVar53[0xb] = uVar41;
              auVar53[0xc] = uVar41;
              auVar53[0xd] = uVar41;
              auVar53[0xe] = uVar41;
              auVar53[0xf] = uVar41;
              auVar53[0x10] = uVar41;
              auVar53[0x11] = uVar41;
              auVar53[0x12] = uVar41;
              auVar53[0x13] = uVar41;
              auVar53[0x14] = uVar41;
              auVar53[0x15] = uVar41;
              auVar53[0x16] = uVar41;
              auVar53[0x17] = uVar41;
              auVar53[0x18] = uVar41;
              auVar53[0x19] = uVar41;
              auVar53[0x1a] = uVar41;
              auVar53[0x1b] = uVar41;
              auVar53[0x1c] = uVar41;
              auVar53[0x1d] = uVar41;
              auVar53[0x1e] = uVar41;
              auVar53[0x1f] = uVar41;
              cVar23 = (char)uVar24 + -0x7f;
              uVar41 = (undefined1)iVar30;
              bVar39 = s1_beg != 0;
              auVar46._4_4_ = 0;
              auVar46._0_4_ = open;
              auVar42._4_4_ = 0;
              auVar42._0_4_ = gap;
              auVar42._8_4_ = gap;
              auVar42._12_4_ = 0;
              auVar42._16_4_ = gap;
              auVar42._20_4_ = 0;
              auVar42._24_4_ = gap;
              auVar42._28_4_ = 0;
              iStack_1d4 = (int)local_218._4_4_ >> 0x1f;
              auVar46._8_4_ = open;
              auVar46._12_4_ = 0;
              auVar46._16_4_ = open;
              auVar46._20_4_ = 0;
              auVar46._24_4_ = open;
              auVar46._28_4_ = 0;
              auVar47._8_8_ = uVar37;
              auVar47._0_8_ = uVar37;
              auVar47._16_8_ = uVar37;
              auVar47._24_8_ = uVar37;
              auVar11 = vpmuldq_avx2(auVar47,_DAT_00908f20);
              auVar54 = vpmuldq_avx2(auVar47,_DAT_00908f40);
              auVar12 = vpmuldq_avx2(auVar47,_DAT_00908f60);
              auVar13 = vpmuldq_avx2(auVar47,_DAT_00908f80);
              auVar59 = vpmuldq_avx2(auVar47,_DAT_00908e00);
              auVar43 = vpmuldq_avx2(auVar47,_DAT_00908e20);
              auVar57 = vpmuldq_avx2(auVar47,_DAT_00908c60);
              auVar47 = vpmuldq_avx2(auVar47,_DAT_00908b60);
              uVar33 = 0;
              auVar58._8_8_ = 0xffffffffffffff80;
              auVar58._0_8_ = 0xffffffffffffff80;
              auVar58._16_8_ = 0xffffffffffffff80;
              auVar58._24_8_ = 0xffffffffffffff80;
              auVar61._8_8_ = 0xff;
              auVar61._0_8_ = 0xff;
              auVar61._16_8_ = 0xff;
              auVar61._24_8_ = 0xff;
              palVar35 = palVar22;
              palVar36 = ptr_00;
              do {
                auVar63._8_8_ = uVar33;
                auVar63._0_8_ = uVar33;
                auVar63._16_8_ = uVar33;
                auVar63._24_8_ = uVar33;
                auVar56 = vpaddq_avx2(auVar63,auVar11);
                auVar48 = vpaddq_avx2(auVar63,auVar54);
                auVar67 = vpaddq_avx2(auVar63,auVar12);
                auVar68 = vpaddq_avx2(auVar63,auVar13);
                auVar70 = vpaddq_avx2(auVar63,auVar59);
                auVar71 = vpaddq_avx2(auVar63,auVar43);
                auVar65 = vpaddq_avx2(auVar63,auVar47);
                auVar63 = vpaddq_avx2(auVar63,auVar57);
                auVar14 = vpmuludq_avx2(auVar63,auVar42);
                auVar63 = vpsrlq_avx2(auVar63,0x20);
                auVar63 = vpmuludq_avx2(auVar63,auVar42);
                auVar63 = vpsllq_avx2(auVar63,0x20);
                auVar63 = vpaddq_avx2(auVar14,auVar63);
                auVar14 = vpmuludq_avx2(auVar65,auVar42);
                auVar65 = vpsrlq_avx2(auVar65,0x20);
                auVar65 = vpmuludq_avx2(auVar65,auVar42);
                auVar65 = vpsllq_avx2(auVar65,0x20);
                auVar65 = vpaddq_avx2(auVar14,auVar65);
                auVar14 = vpmuludq_avx2(auVar71,auVar42);
                auVar71 = vpsrlq_avx2(auVar71,0x20);
                auVar71 = vpmuludq_avx2(auVar71,auVar42);
                auVar71 = vpsllq_avx2(auVar71,0x20);
                auVar71 = vpaddq_avx2(auVar14,auVar71);
                auVar14 = vpmuludq_avx2(auVar70,auVar42);
                auVar70 = vpsrlq_avx2(auVar70,0x20);
                auVar70 = vpmuludq_avx2(auVar70,auVar42);
                auVar70 = vpsllq_avx2(auVar70,0x20);
                auVar70 = vpaddq_avx2(auVar14,auVar70);
                auVar14 = vpmuludq_avx2(auVar68,auVar42);
                auVar68 = vpsrlq_avx2(auVar68,0x20);
                auVar68 = vpmuludq_avx2(auVar68,auVar42);
                auVar68 = vpsllq_avx2(auVar68,0x20);
                auVar68 = vpaddq_avx2(auVar14,auVar68);
                auVar14 = vpmuludq_avx2(auVar67,auVar42);
                auVar67 = vpsrlq_avx2(auVar67,0x20);
                auVar67 = vpmuludq_avx2(auVar67,auVar42);
                auVar67 = vpsllq_avx2(auVar67,0x20);
                auVar67 = vpaddq_avx2(auVar14,auVar67);
                auVar14 = vpmuludq_avx2(auVar48,auVar42);
                auVar48 = vpsrlq_avx2(auVar48,0x20);
                auVar48 = vpmuludq_avx2(auVar48,auVar42);
                auVar48 = vpsllq_avx2(auVar48,0x20);
                auVar48 = vpaddq_avx2(auVar14,auVar48);
                auVar14 = vpmuludq_avx2(auVar56,auVar42);
                auVar56 = vpsrlq_avx2(auVar56,0x20);
                auVar56 = vpmuludq_avx2(auVar56,auVar42);
                auVar56 = vpsllq_avx2(auVar56,0x20);
                auVar56 = vpaddq_avx2(auVar14,auVar56);
                auVar6._8_4_ = local_218._4_4_;
                auVar6._0_8_ = (long)(int)local_218._4_4_;
                auVar6._12_4_ = iStack_1d4;
                auVar6._16_4_ = local_218._4_4_;
                auVar6._20_4_ = iStack_1d4;
                auVar6._24_4_ = local_218._4_4_;
                auVar6._28_4_ = iStack_1d4;
                auVar14 = vpsubq_avx2(auVar6,auVar56);
                auVar15 = vpsubq_avx2(auVar6,auVar48);
                auVar48 = vpsubq_avx2(auVar6,auVar67);
                auVar67 = vpsubq_avx2(auVar6,auVar68);
                auVar68 = vpsubq_avx2(auVar6,auVar70);
                auVar70 = vpsubq_avx2(auVar6,auVar71);
                auVar65 = vpsubq_avx2(auVar6,auVar65);
                auVar71 = vpsubq_avx2(auVar6,auVar63);
                auVar64[1] = bVar39;
                auVar64[0] = bVar39;
                auVar64[2] = bVar39;
                auVar64[3] = bVar39;
                auVar64[4] = bVar39;
                auVar64[5] = bVar39;
                auVar64[6] = bVar39;
                auVar64[7] = bVar39;
                auVar64[8] = bVar39;
                auVar64[9] = bVar39;
                auVar64[10] = bVar39;
                auVar64[0xb] = bVar39;
                auVar64[0xc] = bVar39;
                auVar64[0xd] = bVar39;
                auVar64[0xe] = bVar39;
                auVar64[0xf] = bVar39;
                auVar7[0x10] = bVar39;
                auVar7._0_16_ = auVar64;
                auVar7[0x11] = bVar39;
                auVar7[0x12] = bVar39;
                auVar7[0x13] = bVar39;
                auVar7[0x14] = bVar39;
                auVar7[0x15] = bVar39;
                auVar7[0x16] = bVar39;
                auVar7[0x17] = bVar39;
                auVar7[0x18] = bVar39;
                auVar7[0x19] = bVar39;
                auVar7[0x1a] = bVar39;
                auVar7[0x1b] = bVar39;
                auVar7[0x1c] = bVar39;
                auVar7[0x1d] = bVar39;
                auVar7[0x1e] = bVar39;
                auVar7[0x1f] = bVar39;
                auVar72 = vpmovsxbd_avx(ZEXT416(0x7060504));
                auVar66 = vpshufb_avx(auVar64,auVar72);
                auVar66 = vpslld_avx(auVar66,0x1f);
                auVar66 = vpsrad_avx(auVar66,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar66);
                auVar71 = vpandn_avx2(auVar56,auVar71);
                auVar66 = vpmovzxbd_avx(auVar64);
                auVar66 = vpslld_avx(auVar66,0x1f);
                auVar66 = vpsrad_avx(auVar66,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar66);
                auVar65 = vpandn_avx2(auVar56,auVar65);
                auVar66 = vpmovsxbd_avx(ZEXT416(0xb0a0908));
                auVar62 = vpshufb_avx(auVar64,auVar66);
                auVar62 = vpslld_avx(auVar62,0x1f);
                auVar62 = vpsrad_avx(auVar62,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar62);
                auVar63 = vpandn_avx2(auVar56,auVar70);
                auVar62 = vpmovsxbd_avx(ZEXT416(0xf0e0d0c));
                auVar64 = vpshufb_avx(auVar64,auVar62);
                auVar64 = vpslld_avx(auVar64,0x1f);
                auVar64 = vpsrad_avx(auVar64,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar64);
                auVar6 = vpandn_avx2(auVar56,auVar68);
                auVar45 = auVar7._16_16_;
                auVar64 = vpmovzxbd_avx(auVar45);
                auVar64 = vpslld_avx(auVar64,0x1f);
                auVar64 = vpsrad_avx(auVar64,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar64);
                auVar7 = vpandn_avx2(auVar56,auVar67);
                auVar72 = vpshufb_avx(auVar45,auVar72);
                auVar72 = vpslld_avx(auVar72,0x1f);
                auVar72 = vpsrad_avx(auVar72,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar72);
                auVar8 = vpandn_avx2(auVar56,auVar48);
                auVar72 = vpshufb_avx(auVar45,auVar66);
                auVar66 = vpslld_avx(auVar72,0x1f);
                auVar72 = vpshufb_avx(auVar45,auVar62);
                auVar72 = vpslld_avx(auVar72,0x1f);
                auVar72 = vpsrad_avx(auVar72,0x1f);
                auVar56 = vpmovsxdq_avx2(auVar72);
                auVar9 = vpandn_avx2(auVar56,auVar14);
                auVar56 = vpcmpgtq_avx2(auVar9,auVar58);
                auVar67 = vblendvpd_avx(auVar58,auVar9,auVar56);
                auVar72 = vpsrad_avx(auVar66,0x1f);
                auVar56 = vpcmpgtq_avx2(auVar6,auVar58);
                auVar68 = vblendvpd_avx(auVar58,auVar6,auVar56);
                auVar70 = vpmovsxdq_avx2(auVar72);
                auVar56 = vpcmpgtq_avx2(auVar65,auVar58);
                auVar48 = vblendvpd_avx(auVar58,auVar65,auVar56);
                auVar10 = vpandn_avx2(auVar70,auVar15);
                auVar56 = vpcmpgtq_avx2(auVar71,auVar58);
                auVar56 = vblendvpd_avx(auVar58,auVar71,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar61);
                auVar48 = vandpd_avx(auVar48,auVar61);
                auVar70 = vpackusdw_avx2(auVar48,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar63,auVar58);
                auVar56 = vblendvpd_avx(auVar58,auVar63,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar61);
                auVar48 = vandpd_avx(auVar68,auVar61);
                auVar56 = vpackusdw_avx2(auVar56,auVar48);
                auVar48 = vpcmpgtq_avx2(auVar8,auVar58);
                auVar48 = vblendvpd_avx(auVar58,auVar8,auVar48);
                auVar68 = vpermq_avx2(auVar70,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar14 = vpackusdw_avx2(auVar68,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar7,auVar58);
                auVar56 = vblendvpd_avx(auVar58,auVar7,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar61);
                auVar48 = vandpd_avx(auVar48,auVar61);
                auVar68 = vpackusdw_avx2(auVar56,auVar48);
                auVar56 = vpcmpgtq_avx2(auVar10,auVar58);
                auVar56 = vblendvpd_avx(auVar58,auVar10,auVar56);
                auVar56 = vandpd_avx(auVar56,auVar61);
                auVar48 = vandpd_avx(auVar67,auVar61);
                auVar56 = vpackusdw_avx2(auVar56,auVar48);
                auVar48 = vpermq_avx2(auVar68,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar15 = vpackusdw_avx2(auVar48,auVar56);
                auVar16 = vpsubq_avx2(auVar71,auVar46);
                auVar48 = vpsubq_avx2(auVar65,auVar46);
                auVar67 = vpsubq_avx2(auVar9,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar67,auVar58);
                auVar67 = vblendvpd_avx(auVar58,auVar67,auVar56);
                auVar68 = vpsubq_avx2(auVar10,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar68,auVar58);
                auVar68 = vblendvpd_avx(auVar58,auVar68,auVar56);
                auVar70 = vpsubq_avx2(auVar8,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar70,auVar58);
                auVar70 = vblendvpd_avx(auVar58,auVar70,auVar56);
                auVar71 = vpsubq_avx2(auVar7,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar71,auVar58);
                auVar71 = vblendvpd_avx(auVar58,auVar71,auVar56);
                auVar65 = vpsubq_avx2(auVar6,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar65,auVar58);
                auVar65 = vblendvpd_avx(auVar58,auVar65,auVar56);
                auVar63 = vpsubq_avx2(auVar63,auVar46);
                auVar56 = vpcmpgtq_avx2(auVar63,auVar58);
                auVar63 = vblendvpd_avx(auVar58,auVar63,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar48,auVar58);
                auVar48 = vblendvpd_avx(auVar58,auVar48,auVar56);
                auVar56 = vpcmpgtq_avx2(auVar16,auVar58);
                auVar56 = vblendvpd_avx(auVar58,auVar16,auVar56);
                auVar14 = vpermq_avx2(auVar14,0xd8);
                auVar6 = vpermq_avx2(auVar15,0xd8);
                auVar6 = vpackuswb_avx2(auVar14,auVar6);
                auVar56 = vandpd_avx(auVar56,auVar61);
                auVar48 = vandpd_avx(auVar48,auVar61);
                auVar14 = vpackusdw_avx2(auVar48,auVar56);
                auVar56 = vandpd_avx(auVar63,auVar61);
                auVar48 = vandpd_avx(auVar65,auVar61);
                auVar56 = vpackusdw_avx2(auVar56,auVar48);
                auVar48 = vpermq_avx2(auVar14,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar65 = vpackusdw_avx2(auVar48,auVar56);
                auVar56 = vandpd_avx(auVar71,auVar61);
                auVar48 = vandpd_avx(auVar70,auVar61);
                auVar70 = vpackusdw_avx2(auVar56,auVar48);
                auVar56 = vandpd_avx(auVar68,auVar61);
                auVar48 = vandpd_avx(auVar67,auVar61);
                auVar56 = vpackusdw_avx2(auVar56,auVar48);
                auVar48 = vpermq_avx2(auVar70,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar56 = vpackusdw_avx2(auVar48,auVar56);
                alVar17 = (__m256i)vpermq_avx2(auVar6,0xd8);
                *palVar35 = alVar17;
                auVar48 = vpermq_avx2(auVar65,0xd8);
                auVar56 = vpermq_avx2(auVar56,0xd8);
                auVar56 = vpackuswb_avx2(auVar48,auVar56);
                alVar18 = (__m256i)vpermq_avx2(auVar56,0xd8);
                *palVar36 = alVar18;
                uVar33 = uVar33 + 1;
                palVar36 = palVar36 + 1;
                palVar35 = palVar35 + 1;
              } while (uVar37 != uVar33);
              *ptr_01 = '\0';
              lVar28 = (ulong)(uint)s2Len - 1;
              auVar66._8_8_ = lVar28;
              auVar66._0_8_ = lVar28;
              auVar57._16_8_ = lVar28;
              auVar57._0_16_ = auVar66;
              auVar57._24_8_ = lVar28;
              local_1f8._4_4_ = gap;
              local_1f8._0_4_ = gap;
              local_1f8._8_4_ = gap;
              local_1f8._12_4_ = gap;
              local_1f8._16_4_ = gap;
              local_1f8._20_4_ = gap;
              local_1f8._24_4_ = gap;
              local_1f8._28_4_ = gap;
              local_218._0_4_ = local_218._4_4_;
              local_218._8_4_ = local_218._4_4_;
              local_218._12_4_ = local_218._4_4_;
              local_218._16_4_ = local_218._4_4_;
              local_218._20_4_ = local_218._4_4_;
              local_218._24_4_ = local_218._4_4_;
              local_218._28_4_ = local_218._4_4_;
              auVar13 = vpmovsxbd_avx2(ZEXT816(0x201f1e1d1c1b1a19));
              auVar12 = vpmovsxbd_avx2(ZEXT816(0x1817161514131211));
              auVar54 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
              auVar11 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
              uVar33 = 0;
              auVar62._8_8_ = 0x8000000000000000;
              auVar62._0_8_ = 0x8000000000000000;
              auVar72 = vpcmpeqd_avx(auVar15._0_16_,auVar15._0_16_);
              auVar59 = vpcmpeqd_avx2((undefined1  [32])alVar17,(undefined1  [32])alVar17);
              local_238._8_4_ = 0xffffff80;
              local_238._0_8_ = 0xffffff80ffffff80;
              local_238._12_4_ = 0xffffff80;
              local_238._16_4_ = 0xffffff80;
              local_238._20_4_ = 0xffffff80;
              local_238._24_4_ = 0xffffff80;
              local_238._28_4_ = 0xffffff80;
              local_258._8_4_ = 0xff;
              local_258._0_8_ = 0xff000000ff;
              local_258._12_4_ = 0xff;
              local_258._16_4_ = 0xff;
              local_258._20_4_ = 0xff;
              local_258._24_4_ = 0xff;
              local_258._28_4_ = 0xff;
              auVar56._8_8_ = 0x8000000000000000;
              auVar56._0_8_ = 0x8000000000000000;
              auVar56._16_8_ = 0x8000000000000000;
              auVar56._24_8_ = 0x8000000000000000;
              auVar43 = ZEXT1632(CONCAT412(4,CONCAT48(4,0x400000004)));
              do {
                if (s2_beg == 0) {
                  auVar47 = vpaddd_avx2(auVar11,auVar59);
                  auVar42 = vpaddd_avx2(auVar54,auVar59);
                  auVar46 = vpaddd_avx2(auVar12,auVar59);
                  auVar58 = vpaddd_avx2(auVar13,auVar59);
                  auVar58 = vpmulld_avx2(auVar58,local_1f8);
                  auVar46 = vpmulld_avx2(auVar46,local_1f8);
                  auVar42 = vpmulld_avx2(auVar42,local_1f8);
                  auVar47 = vpmulld_avx2(auVar47,local_1f8);
                  auVar47 = vpsubd_avx2(local_218,auVar47);
                  auVar42 = vpsubd_avx2(local_218,auVar42);
                  auVar61 = vpsubd_avx2(local_218,auVar46);
                  auVar46 = vpsubd_avx2(local_218,auVar58);
                  auVar46 = vpmaxsd_avx2(auVar46,local_238);
                  auVar58 = vpmaxsd_avx2(auVar61,local_238);
                  auVar42 = vpmaxsd_avx2(auVar42,local_238);
                  auVar47 = vpmaxsd_avx2(auVar47,local_238);
                  auVar47 = vpand_avx2(auVar47,local_258);
                  auVar42 = vpand_avx2(auVar42,local_258);
                  auVar47 = vpackusdw_avx2(auVar47,auVar42);
                  auVar61 = vpermq_avx2(auVar47,0xd8);
                  auVar47 = vpand_avx2(auVar58,local_258);
                  auVar42 = vpand_avx2(auVar46,local_258);
                  auVar47 = vpackusdw_avx2(auVar47,auVar42);
                  auVar47 = vpermq_avx2(auVar47,0xd8);
                  auVar47 = vpackuswb_avx2(auVar61,auVar47);
                  auVar47 = vpermq_avx2(auVar47,0xd8);
                  auVar69 = auVar47._0_24_;
                }
                else {
                  auVar69 = SUB6424(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar48._8_8_ = uVar33;
                auVar48._0_8_ = uVar33;
                auVar48._16_8_ = uVar33;
                auVar48._24_8_ = uVar33;
                auVar47 = vpor_avx2(auVar48,_DAT_00908b60);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar47._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 1] = auVar69[0];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar47._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 2] = auVar69[1];
                }
                auVar46 = auVar56 ^ auVar57;
                auVar47 = vpcmpgtq_avx2(auVar56 ^ auVar47,auVar46);
                auVar42 = vpshuflw_avx2(auVar47,0xe8);
                auVar42 = vpermd_avx2(auVar43,auVar42 ^ auVar59);
                auVar64 = vpackssdw_avx(auVar42._0_16_,auVar42._0_16_);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 3] = auVar69[2];
                }
                auVar64 = vpackssdw_avx(auVar47._16_16_,auVar47._16_16_);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 4] = auVar69[3];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908c60);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar47,auVar42);
                auVar45._0_2_ = auVar47._16_2_;
                auVar45._2_2_ = auVar45._0_2_;
                auVar45._4_2_ = auVar45._0_2_;
                auVar45._6_2_ = auVar45._0_2_;
                auVar45._8_2_ = auVar45._0_2_;
                auVar45._10_2_ = auVar45._0_2_;
                auVar45._12_2_ = auVar45._0_2_;
                auVar45._14_2_ = auVar45._0_2_;
                auVar64 = vpacksswb_avx(auVar45,auVar45);
                if ((auVar64 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 5] = auVar69[4];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpshufhw_avx(auVar64,0x84);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar47,auVar42);
                auVar50._0_4_ = auVar47._16_4_;
                auVar50._4_4_ = auVar50._0_4_;
                auVar50._8_4_ = auVar50._0_4_;
                auVar50._12_4_ = auVar50._0_4_;
                auVar64 = vpacksswb_avx(auVar50,auVar50);
                if ((auVar64 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 6] = auVar69[5];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpackssdw_avx2(auVar42,auVar42);
                auVar64 = auVar72 ^ auVar47._16_16_;
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 7] = auVar69[6];
                }
                auVar47 = vpshufhw_avx2(auVar42,0x84);
                auVar64 = auVar72 ^ auVar47._16_16_;
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 8] = auVar69[7];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908e20);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpmovzxwd_avx2(auVar64);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar33 + 9] = auVar69[0];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 10] = auVar69[1];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpshuflw_avx2(auVar42,0xe8);
                auVar47 = vpermd_avx2(auVar43,auVar47 ^ auVar59);
                auVar64 = vpackssdw_avx(auVar47._0_16_,auVar47._0_16_);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0xb] = auVar69[2];
                }
                auVar64 = vpackssdw_avx(auVar42._16_16_,auVar42._16_16_);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar47,auVar47);
                if ((auVar47._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0xc] = auVar69[3];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908e00);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar42,auVar47);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0xd] = auVar69[4];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpshufhw_avx(auVar64,0x84);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar42,auVar47);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0xe] = auVar69[5];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpackssdw_avx2(auVar42,auVar42);
                auVar47 = vpackssdw_avx2(auVar42,auVar47 ^ auVar59);
                auVar47 = vpacksswb_avx2(auVar47,auVar42);
                if ((auVar47._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0xf] = auVar69[6];
                }
                auVar47 = vpshufhw_avx2(auVar42,0x84);
                auVar47 = vpackssdw_avx2(auVar47 ^ auVar59,auVar47 ^ auVar59);
                auVar47 = vpacksswb_avx2(auVar47,auVar47);
                if ((auVar47._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x10] = auVar69[7];
                }
                auVar47 = vpor_avx2(auVar48,_DAT_00908f80);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar47._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x11] = auVar69[0x10];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar47._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x12] = auVar69[0x11];
                }
                auVar47 = vpcmpgtq_avx2(auVar56 ^ auVar47,auVar46);
                auVar42 = vpshuflw_avx2(auVar47,0xe8);
                auVar42 = vpermd_avx2(auVar43,auVar42 ^ auVar59);
                auVar64 = vpackssdw_avx(auVar42._0_16_,auVar42._0_16_);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x13] = auVar69[0x12];
                }
                auVar64 = vpackssdw_avx(auVar47._16_16_,auVar47._16_16_);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x14] = auVar69[0x13];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908f60);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar47,auVar42);
                auVar51._0_2_ = auVar47._16_2_;
                auVar51._2_2_ = auVar51._0_2_;
                auVar51._4_2_ = auVar51._0_2_;
                auVar51._6_2_ = auVar51._0_2_;
                auVar51._8_2_ = auVar51._0_2_;
                auVar51._10_2_ = auVar51._0_2_;
                auVar51._12_2_ = auVar51._0_2_;
                auVar51._14_2_ = auVar51._0_2_;
                auVar64 = vpacksswb_avx(auVar51,auVar51);
                if ((auVar64 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x15] = auVar69[0x14];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpshufhw_avx(auVar64,0x84);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar47,auVar42);
                auVar52._0_4_ = auVar47._16_4_;
                auVar52._4_4_ = auVar52._0_4_;
                auVar52._8_4_ = auVar52._0_4_;
                auVar52._12_4_ = auVar52._0_4_;
                auVar64 = vpacksswb_avx(auVar52,auVar52);
                if ((auVar64 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x16] = auVar69[0x15];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpackssdw_avx2(auVar42,auVar42);
                auVar64 = auVar72 ^ auVar47._16_16_;
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x17] = auVar69[0x16];
                }
                auVar47 = vpshufhw_avx2(auVar42,0x84);
                auVar64 = auVar72 ^ auVar47._16_16_;
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpacksswb_avx(auVar64,auVar64);
                if ((auVar64 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x18] = auVar69[0x17];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908f40);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpmovzxwd_avx2(auVar64);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
                  ptr_01[uVar33 + 0x19] = auVar69[0x10];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1a] = auVar69[0x11];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpshuflw_avx2(auVar42,0xe8);
                auVar47 = vpermd_avx2(auVar43,auVar47 ^ auVar59);
                auVar64 = vpackssdw_avx(auVar47._0_16_,auVar47._0_16_);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1b] = auVar69[0x12];
                }
                auVar64 = vpackssdw_avx(auVar42._16_16_,auVar42._16_16_);
                auVar64 = vpackssdw_avx(auVar72 ^ auVar64,auVar72 ^ auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar64),0x55);
                auVar47 = vpacksswb_avx2(auVar47,auVar47);
                if ((auVar47._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1c] = auVar69[0x13];
                }
                auVar42 = vpor_avx2(auVar48,_DAT_00908f20);
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpackssdw_avx(auVar64,auVar64);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar42,auVar47);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1d] = auVar69[0x14];
                }
                auVar64 = vpcmpgtq_avx(auVar62 ^ auVar42._0_16_,auVar62 ^ auVar66);
                auVar64 = vpshufhw_avx(auVar64,0x84);
                auVar47 = vpermq_avx2(ZEXT1632(auVar72 ^ auVar64),0x55);
                auVar47 = vpackssdw_avx2(auVar42,auVar47);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1e] = auVar69[0x15];
                }
                auVar42 = vpcmpgtq_avx2(auVar56 ^ auVar42,auVar46);
                auVar47 = vpackssdw_avx2(auVar42,auVar42);
                auVar47 = vpackssdw_avx2(auVar42,auVar47 ^ auVar59);
                auVar47 = vpacksswb_avx2(auVar42,auVar47);
                if ((auVar47._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar33 + 0x1f] = auVar69[0x16];
                }
                auVar47 = vpshufhw_avx2(auVar42,0x84);
                auVar47 = vpackssdw_avx2(auVar47 ^ auVar59,auVar47 ^ auVar59);
                auVar47 = vpacksswb_avx2(auVar47,auVar47);
                if ((auVar47 & (undefined1  [32])0x100000000000000) != (undefined1  [32])0x0) {
                  ptr_01[uVar33 + 0x20] = auVar69[0x17];
                }
                uVar33 = uVar33 + 0x20;
                auVar67._8_4_ = 0x20;
                auVar67._0_8_ = 0x2000000020;
                auVar67._12_4_ = 0x20;
                auVar67._16_4_ = 0x20;
                auVar67._20_4_ = 0x20;
                auVar67._24_4_ = 0x20;
                auVar67._28_4_ = 0x20;
                auVar11 = vpaddd_avx2(auVar11,auVar67);
                auVar54 = vpaddd_avx2(auVar54,auVar67);
                auVar12 = vpaddd_avx2(auVar12,auVar67);
                auVar13 = vpaddd_avx2(auVar13,auVar67);
              } while ((s2Len + 0x1fU & 0xffffffe0) != uVar33);
              uVar24 = (uint)uVar37;
              uVar33 = 0;
              auVar11[1] = uVar41;
              auVar11[0] = uVar41;
              auVar11[2] = uVar41;
              auVar11[3] = uVar41;
              auVar11[4] = uVar41;
              auVar11[5] = uVar41;
              auVar11[6] = uVar41;
              auVar11[7] = uVar41;
              auVar11[8] = uVar41;
              auVar11[9] = uVar41;
              auVar11[10] = uVar41;
              auVar11[0xb] = uVar41;
              auVar11[0xc] = uVar41;
              auVar11[0xd] = uVar41;
              auVar11[0xe] = uVar41;
              auVar11[0xf] = uVar41;
              auVar11[0x10] = uVar41;
              auVar11[0x11] = uVar41;
              auVar11[0x12] = uVar41;
              auVar11[0x13] = uVar41;
              auVar11[0x14] = uVar41;
              auVar11[0x15] = uVar41;
              auVar11[0x16] = uVar41;
              auVar11[0x17] = uVar41;
              auVar11[0x18] = uVar41;
              auVar11[0x19] = uVar41;
              auVar11[0x1a] = uVar41;
              auVar11[0x1b] = uVar41;
              auVar11[0x1c] = uVar41;
              auVar11[0x1d] = uVar41;
              auVar11[0x1e] = uVar41;
              auVar11[0x1f] = uVar41;
              auVar11 = vpcmpeqb_avx2(auVar11,_DAT_00909020);
              auVar13[1] = cVar23;
              auVar13[0] = cVar23;
              auVar13[2] = cVar23;
              auVar13[3] = cVar23;
              auVar13[4] = cVar23;
              auVar13[5] = cVar23;
              auVar13[6] = cVar23;
              auVar13[7] = cVar23;
              auVar13[8] = cVar23;
              auVar13[9] = cVar23;
              auVar13[10] = cVar23;
              auVar13[0xb] = cVar23;
              auVar13[0xc] = cVar23;
              auVar13[0xd] = cVar23;
              auVar13[0xe] = cVar23;
              auVar13[0xf] = cVar23;
              auVar13[0x10] = cVar23;
              auVar13[0x11] = cVar23;
              auVar13[0x12] = cVar23;
              auVar13[0x13] = cVar23;
              auVar13[0x14] = cVar23;
              auVar13[0x15] = cVar23;
              auVar13[0x16] = cVar23;
              auVar13[0x17] = cVar23;
              auVar13[0x18] = cVar23;
              auVar13[0x19] = cVar23;
              auVar13[0x1a] = cVar23;
              auVar13[0x1b] = cVar23;
              auVar13[0x1c] = cVar23;
              auVar13[0x1d] = cVar23;
              auVar13[0x1e] = cVar23;
              auVar13[0x1f] = cVar23;
              auVar55 = ZEXT3264(auVar13);
              auVar44 = ZEXT3264(auVar13);
              auVar12[1] = cVar29;
              auVar12[0] = cVar29;
              auVar12[2] = cVar29;
              auVar12[3] = cVar29;
              auVar12[4] = cVar29;
              auVar12[5] = cVar29;
              auVar12[6] = cVar29;
              auVar12[7] = cVar29;
              auVar12[8] = cVar29;
              auVar12[9] = cVar29;
              auVar12[10] = cVar29;
              auVar12[0xb] = cVar29;
              auVar12[0xc] = cVar29;
              auVar12[0xd] = cVar29;
              auVar12[0xe] = cVar29;
              auVar12[0xf] = cVar29;
              auVar12[0x10] = cVar29;
              auVar12[0x11] = cVar29;
              auVar12[0x12] = cVar29;
              auVar12[0x13] = cVar29;
              auVar12[0x14] = cVar29;
              auVar12[0x15] = cVar29;
              auVar12[0x16] = cVar29;
              auVar12[0x17] = cVar29;
              auVar12[0x18] = cVar29;
              auVar12[0x19] = cVar29;
              auVar12[0x1a] = cVar29;
              auVar12[0x1b] = cVar29;
              auVar12[0x1c] = cVar29;
              auVar12[0x1d] = cVar29;
              auVar12[0x1e] = cVar29;
              auVar12[0x1f] = cVar29;
              auVar49 = ZEXT3264(auVar12);
              auVar54[1] = uVar40;
              auVar54[0] = uVar40;
              auVar54[2] = uVar40;
              auVar54[3] = uVar40;
              auVar54[4] = uVar40;
              auVar54[5] = uVar40;
              auVar54[6] = uVar40;
              auVar54[7] = uVar40;
              auVar54[8] = uVar40;
              auVar54[9] = uVar40;
              auVar54[10] = uVar40;
              auVar54[0xb] = uVar40;
              auVar54[0xc] = uVar40;
              auVar54[0xd] = uVar40;
              auVar54[0xe] = uVar40;
              auVar54[0xf] = uVar40;
              auVar54[0x10] = uVar40;
              auVar54[0x11] = uVar40;
              auVar54[0x12] = uVar40;
              auVar54[0x13] = uVar40;
              auVar54[0x14] = uVar40;
              auVar54[0x15] = uVar40;
              auVar54[0x16] = uVar40;
              auVar54[0x17] = uVar40;
              auVar54[0x18] = uVar40;
              auVar54[0x19] = uVar40;
              auVar54[0x1a] = uVar40;
              auVar54[0x1b] = uVar40;
              auVar54[0x1c] = uVar40;
              auVar54[0x1d] = uVar40;
              auVar54[0x1e] = uVar40;
              auVar54[0x1f] = uVar40;
              iVar34 = iVar25;
              do {
                palVar35 = ptr;
                ptr = palVar22;
                auVar72 = SUB3216(ptr[uVar24 - 1],0);
                auVar59._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar44._0_16_;
                auVar59._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar72;
                auVar59 = vpalignr_avx2((undefined1  [32])ptr[uVar24 - 1],auVar59,0xf);
                iVar38 = ppVar4->mapper[(byte)s2[uVar33]];
                auVar72 = vpinsrb_avx(auVar59._0_16_,(uint)(byte)ptr_01[uVar33],0);
                auVar59 = vpblendd_avx2(auVar59,ZEXT1632(auVar72),0xf);
                lVar28 = 0;
                auVar60 = ZEXT3264(auVar13);
                do {
                  auVar43 = vpaddsb_avx2(auVar59,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar28 + (long)iVar38 * uVar37 * 0x20));
                  auVar59 = *(undefined1 (*) [32])((long)*ptr_00 + lVar28);
                  auVar47 = auVar60._0_32_;
                  auVar57 = vpmaxsb_avx2(auVar59,auVar47);
                  auVar43 = vpmaxsb_avx2(auVar43,auVar57);
                  *(undefined1 (*) [32])((long)*palVar35 + lVar28) = auVar43;
                  auVar57 = vpmaxsb_avx2(auVar44._0_32_,auVar43);
                  auVar44 = ZEXT3264(auVar57);
                  auVar57 = vpminsb_avx2(auVar49._0_32_,auVar59);
                  auVar57 = vpminsb_avx2(auVar57,auVar47);
                  auVar57 = vpminsb_avx2(auVar57,auVar43);
                  auVar49 = ZEXT3264(auVar57);
                  auVar43 = vpsubsb_avx2(auVar43,auVar54);
                  auVar59 = vpsubsb_avx2(auVar59,auVar53);
                  auVar59 = vpmaxsb_avx2(auVar59,auVar43);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar28) = auVar59;
                  auVar59 = vpsubsb_avx2(auVar47,auVar53);
                  auVar59 = vpmaxsb_avx2(auVar59,auVar43);
                  auVar60 = ZEXT3264(auVar59);
                  auVar59 = *(undefined1 (*) [32])((long)*ptr + lVar28);
                  lVar28 = lVar28 + 0x20;
                } while (uVar37 << 5 != lVar28);
                iVar38 = 0;
                do {
                  iVar31 = local_218._4_4_;
                  if (s2_beg == 0) {
                    iVar31 = ptr_01[uVar33 + 1] - open;
                  }
                  if (iVar31 < -0x7f) {
                    iVar31 = -0x80;
                  }
                  auVar43._0_16_ = ZEXT116(0) * auVar60._0_16_ + ZEXT116(1) * auVar44._0_16_;
                  auVar43._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar60._0_16_;
                  auVar59 = vpalignr_avx2(auVar60._0_32_,auVar43,0xf);
                  auVar72 = vpinsrb_avx(auVar59._0_16_,iVar31,0);
                  auVar59 = vpblendd_avx2(auVar59,ZEXT1632(auVar72),0xf);
                  auVar60 = ZEXT3264(auVar59);
                  lVar28 = 0;
                  do {
                    auVar59 = vpmaxsb_avx2(auVar60._0_32_,
                                           *(undefined1 (*) [32])((long)*palVar35 + lVar28));
                    *(undefined1 (*) [32])((long)*palVar35 + lVar28) = auVar59;
                    auVar57 = vpminsb_avx2(auVar49._0_32_,auVar59);
                    auVar49 = ZEXT3264(auVar57);
                    auVar43 = vpmaxsb_avx2(auVar44._0_32_,auVar59);
                    auVar44 = ZEXT3264(auVar43);
                    auVar59 = vpsubsb_avx2(auVar59,auVar54);
                    auVar47 = vpsubsb_avx2(auVar60._0_32_,auVar53);
                    auVar60 = ZEXT3264(auVar47);
                    auVar59 = vpcmpgtb_avx2(auVar47,auVar59);
                    if ((((((((((((((((((((((((((((((((auVar59 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar59 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar59 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar59 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar59 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar59 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar59 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar59 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar59 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar59 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar59 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar59 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar59 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar59 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar59 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar59 >> 0x7f,0) == '\0')
                                      && (auVar59 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar59 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar59 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar59 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar59 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar59 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar59 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar59 >> 0xbf,0) == '\0') &&
                              (auVar59 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar59 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar59 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar59 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar59 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar59 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar59 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar59[0x1f]) goto LAB_007797d4;
                    lVar28 = lVar28 + 0x20;
                  } while (uVar37 << 5 != lVar28);
                  iVar38 = iVar38 + 1;
                } while (iVar38 != 0x20);
LAB_007797d4:
                auVar59 = vpcmpgtb_avx2((undefined1  [32])palVar35[uVar5],auVar55._0_32_);
                auVar59 = vpand_avx2(auVar59,auVar11);
                auVar47 = vpmaxsb_avx2((undefined1  [32])palVar35[uVar5],auVar55._0_32_);
                auVar55 = ZEXT3264(auVar47);
                if ((((((((((((((((((((((((((((((((auVar59 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar59 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar59 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar59 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar59 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar59 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar59 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar59 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar59 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar59 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar59 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar59 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar59 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar59 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar59 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar59 >> 0x7f,0) != '\0') ||
                                  (auVar59 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar59 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar59 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar59 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar59 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar59 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar59 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar59 >> 0xbf,0) != '\0') ||
                          (auVar59 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar59 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar59 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar59 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar59 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar59 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar59 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar59[0x1f] < '\0') {
                  iVar34 = (int)uVar33;
                }
                uVar33 = uVar33 + 1;
                palVar22 = palVar35;
                if (uVar33 == (uint)s2Len) {
                  if ((s2_end != 0) && (cVar23 = auVar47[0x17], iVar26 < 0x1f)) {
                    iVar38 = 0;
                    do {
                      auVar54 = auVar55._0_32_;
                      auVar11 = vperm2i128_avx2(auVar54,auVar54,8);
                      auVar11 = vpalignr_avx2(auVar54,auVar11,0xf);
                      cVar23 = auVar11[0x17];
                      auVar55 = ZEXT3264(auVar11);
                      iVar38 = iVar38 + 1;
                    } while (iVar38 < iVar30);
                  }
                  uVar27 = uVar20;
                  if ((s1_end != 0) && (((ulong)uVar2 + 0x1f & 0x7fffffe0) != 0)) {
                    uVar37 = 0;
                    do {
                      uVar32 = ((uint)uVar37 & 0x1f) * uVar24 + ((uint)(uVar37 >> 5) & 0x7ffffff);
                      iVar38 = iVar34;
                      uVar19 = uVar27;
                      cVar29 = cVar23;
                      if (((int)uVar32 < (int)uVar2) &&
                         (cVar1 = *(char *)((long)*palVar35 + uVar37), iVar38 = iVar25,
                         uVar19 = uVar32, cVar29 = cVar1, cVar1 <= cVar23)) {
                        if ((int)uVar27 <= (int)uVar32) {
                          uVar32 = uVar27;
                        }
                        if (iVar34 != iVar25) {
                          uVar32 = uVar27;
                        }
                        iVar38 = iVar34;
                        uVar19 = uVar27;
                        cVar29 = cVar23;
                        if (cVar1 == cVar23) {
                          uVar19 = uVar32;
                        }
                      }
                      cVar23 = cVar29;
                      uVar27 = uVar19;
                      iVar34 = iVar38;
                      uVar37 = uVar37 + 1;
                    } while ((uVar24 & 0x3ffffff) << 5 != (int)uVar37);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    alVar17 = palVar35[uVar5];
                    cVar23 = alVar17[2]._7_1_;
                    iVar34 = iVar25;
                    uVar27 = uVar20;
                    if (iVar26 < 0x1f) {
                      iVar26 = 0;
                      do {
                        auVar11 = vperm2i128_avx2((undefined1  [32])alVar17,
                                                  (undefined1  [32])alVar17,0x28);
                        alVar17 = (__m256i)vpalignr_avx2((undefined1  [32])alVar17,auVar11,0xf);
                        cVar23 = alVar17[2]._7_1_;
                        iVar26 = iVar26 + 1;
                      } while (iVar26 < iVar30);
                    }
                  }
                  auVar11 = vpcmpgtb_avx2(auVar13,auVar57);
                  auVar54 = vpcmpgtb_avx2(auVar43,auVar12);
                  auVar11 = vpor_avx2(auVar54,auVar11);
                  if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar11 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar11 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar11 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar11 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar11 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar11 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar11 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar11 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar11 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar11 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar11 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0')
                                    || (auVar11 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar11 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar11 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar11 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar11 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar11 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0xbf,0) != '\0') ||
                            (auVar11 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar11 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar11 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar11 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar11 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar11 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar11[0x1f] < '\0') {
                    *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                    cVar23 = '\0';
                    iVar34 = 0;
                    uVar27 = 0;
                  }
                  ppVar21->score = (int)cVar23;
                  ppVar21->end_query = uVar27;
                  ppVar21->end_ref = iVar34;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(palVar35);
                  return ppVar21;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}